

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileScalarFallback::
     Finalize<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
               (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state,
               AggregateFinalizeData *finalize_data)

{
  FunctionData *pFVar1;
  reference q;
  OrderModifiers in_R9W;
  idx_t n;
  RESULT_TYPE RVar2;
  string_t sort_key;
  Interpolator<true> interp;
  QuantileDirect<duckdb::string_t> local_49;
  Interpolator<true> local_48;
  
  if ((state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    q = vector<duckdb::QuantileValue,_true>::get<true>
                  ((vector<duckdb::QuantileValue,_true> *)(pFVar1 + 1),0);
    n = (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
              super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
              super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
              super__Vector_impl_data._M_start >> 4;
    local_48.desc = *(bool *)&pFVar1[7]._vptr_FunctionData;
    local_48.FRN = Interpolator<true>::Index(q,n);
    local_48.begin = 0;
    local_48.CRN = local_48.FRN;
    local_48.end = n;
    RVar2 = Interpolator<true>::
            InterpolateInternal<duckdb::string_t,duckdb::QuantileDirect<duckdb::string_t>>
                      (&local_48,
                       (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                       super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                       _M_impl.super__Vector_impl_data._M_start,&local_49);
    sort_key.value.pointer.ptr = (char *)finalize_data->result;
    sort_key.value._0_8_ = RVar2.value._8_8_;
    CreateSortKeyHelpers::DecodeSortKey
              (RVar2.value._0_8_,sort_key,(Vector *)finalize_data->result_idx,0x302,in_R9W);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<true> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		auto interpolation_result = interp.InterpolateInternal<string_t>(state.v.data());
		CreateSortKeyHelpers::DecodeSortKey(interpolation_result, finalize_data.result, finalize_data.result_idx,
		                                    OrderModifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST));
	}